

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stripctrl.c
# Opt level: O2

void stripctrl_locale_put_wc(StripCtrlCharsImpl *scc,wchar_t wc)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  size_t len;
  char outbuf [16];
  char acStack_28 [16];
  
  uVar1 = mk_wcwidth(wc);
  iVar2 = iswprint(wc);
  if (((iVar2 == 0 || (int)uVar1 < 0) && (wc != L'\n')) &&
     ((wc != L'\r' || (scc->permit_cr != true)))) {
    wc = scc->substitution;
    if (wc == L'\0') {
      return;
    }
    uVar3 = mk_wcwidth(wc);
    if ((int)uVar3 < 0) {
      __assert_fail("width >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/stripctrl.c"
                    ,0xaa,"void stripctrl_locale_put_wc(StripCtrlCharsImpl *, wchar_t)");
    }
  }
  else {
    uVar3 = 0;
    if (0 < (int)uVar1) {
      uVar3 = uVar1;
    }
  }
  stripctrl_check_line_limit(scc,wc,(ulong)uVar3);
  len = wcrtomb(acStack_28,wc,(mbstate_t *)&scc->mbs_out);
  if (len != 0) {
    BinarySink_put_data(scc->bs_out->binarysink_,acStack_28,len);
  }
  return;
}

Assistant:

static inline void stripctrl_locale_put_wc(StripCtrlCharsImpl *scc, wchar_t wc)
{
    int width = mk_wcwidth(wc);
    if ((iswprint(wc) && width >= 0) || stripctrl_ctrlchar_ok(scc, wc)) {
        /* Printable character, or one we're going to let through anyway. */
        if (width < 0)
            width = 0;   /* sanitise for stripctrl_check_line_limit */
    } else if (scc->substitution) {
        wc = scc->substitution;
        width = mk_wcwidth(wc);
        assert(width >= 0);
    } else {
        /* No defined substitution, so don't write any output wchar_t. */
        return;
    }

    stripctrl_check_line_limit(scc, wc, width);

    char outbuf[MB_LEN_MAX];
    size_t produced = wcrtomb(outbuf, wc, &scc->mbs_out);
    if (produced > 0)
        put_data(scc->bs_out, outbuf, produced);
}